

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

AMQP_VALUE amqpvalue_create_sasl_response(SASL_RESPONSE_HANDLE sasl_response)

{
  AMQP_VALUE pAVar1;
  
  if (sasl_response != (SASL_RESPONSE_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(sasl_response->composite_value);
    return pAVar1;
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_sasl_response(SASL_RESPONSE_HANDLE sasl_response)
{
    AMQP_VALUE result;

    if (sasl_response == NULL)
    {
        result = NULL;
    }
    else
    {
        SASL_RESPONSE_INSTANCE* sasl_response_instance = (SASL_RESPONSE_INSTANCE*)sasl_response;
        result = amqpvalue_clone(sasl_response_instance->composite_value);
    }

    return result;
}